

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  iterator b;
  TypeParam *db;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  undefined8 in_stack_fffffffffffff718;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff720;
  iterator *__return_storage_ptr__;
  string local_8c8;
  AssertHelper local_8a8;
  Message local_8a0;
  bool local_891;
  AssertionResult local_890;
  string local_880;
  AssertHelper local_860;
  Message local_858 [2];
  undefined1 local_848 [23];
  bool local_831;
  AssertionResult local_830;
  AssertHelper local_820;
  Message local_818;
  int local_80c;
  key_view local_808;
  _Map_pointer local_7f8;
  AssertionResult local_7f0;
  string local_7e0;
  AssertHelper local_7c0;
  Message local_7b8;
  bool local_7a9;
  AssertionResult local_7a8;
  string local_798;
  AssertHelper local_778;
  Message local_770 [2];
  undefined1 local_760 [23];
  bool local_749;
  AssertionResult local_748;
  AssertHelper local_738;
  Message local_730;
  int local_724;
  key_view local_720;
  _Map_pointer local_710;
  AssertionResult local_708;
  string local_6f8;
  AssertHelper local_6d8;
  Message local_6d0;
  bool local_6c1;
  AssertionResult local_6c0;
  iterator local_6b0;
  pointer local_540;
  size_t sStack_538;
  pointer local_520;
  size_t sStack_518;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffff720,SUB81((ulong)in_stack_fffffffffffff718 >> 0x38,0));
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_520 = pvVar2->_M_ptr;
  sStack_518 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_540 = pvVar2->_M_ptr;
  sStack_538 = (pvVar2->_M_extent)._M_extent_value;
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,1,v_00,false);
  __return_storage_ptr__ = &local_6b0;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(__return_storage_ptr__,local_508);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::last
            (__return_storage_ptr__);
  local_6c1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_6b0);
  testing::AssertionResult::AssertionResult<bool>(&local_6c0,&local_6c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6f8,(internal *)&local_6c0,(AssertionResult *)"b.valid()","false","true",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_6f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult(&local_6c0);
  local_720 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(&local_6b0);
  akey._M_extent = local_720._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_710 = (_Map_pointer)decode((anon_unknown_dwarf_d5c8 *)local_720._M_ptr,akey);
  local_724 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_708,"(decode(b.get_key()))","(1)",(unsigned_long *)&local_710,
             &local_724);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_708);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar3 = testing::AssertionResult::failure_message(&local_708);
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_738,&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult(&local_708);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_760);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_749 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_760,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_748,&local_749,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_760)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_748);
  if (!bVar1) {
    testing::Message::Message(local_770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_798,(internal *)&local_748,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_798);
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_778,local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    std::__cxx11::string::~string((string *)&local_798);
    testing::Message::~Message(local_770);
  }
  testing::AssertionResult::~AssertionResult(&local_748);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
            (&local_6b0);
  local_7a9 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_6b0);
  testing::AssertionResult::AssertionResult<bool>(&local_7a8,&local_7a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7e0,(internal *)&local_7a8,(AssertionResult *)"b.valid()","false","true",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_7e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    std::__cxx11::string::~string((string *)&local_7e0);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult(&local_7a8);
  local_808 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(&local_6b0);
  akey_00._M_extent = local_808._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_7f8 = (_Map_pointer)decode((anon_unknown_dwarf_d5c8 *)local_808._M_ptr,akey_00);
  local_80c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_7f0,"(decode(b.get_key()))","(0)",(unsigned_long *)&local_7f8,
             &local_80c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7f0);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    pcVar3 = testing::AssertionResult::failure_message(&local_7f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult(&local_7f0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_848);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_831 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_848,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_830,&local_831,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_848)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_830);
  if (!bVar1) {
    testing::Message::Message(local_858);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_880,(internal *)&local_830,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_880);
    testing::internal::AssertHelper::AssertHelper
              (&local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_860,local_858);
    testing::internal::AssertHelper::~AssertHelper(&local_860);
    std::__cxx11::string::~string((string *)&local_880);
    testing::Message::~Message(local_858);
  }
  testing::AssertionResult::~AssertionResult(&local_830);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
            (&local_6b0);
  local_891 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_6b0);
  local_891 = !local_891;
  testing::AssertionResult::AssertionResult<bool>(&local_890,&local_891,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8c8,(internal *)&local_890,(AssertionResult *)"b.valid()","true","false",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_8c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult(&local_890);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_6b0);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, I4AndTwoLeavesReverseScan) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  auto b = db.test_only_iterator();
  b.last();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.prior();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.prior();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}